

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImRect ImGui::GetPopupAllowedExtentRect(ImGuiWindow *window)

{
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  ImGuiContext *g;
  float fVar3;
  float fVar4;
  ImRect IVar5;
  ImRect IVar6;
  
  pIVar2 = GImGui;
  IVar5 = ImGuiViewportP::GetMainRect(*(GImGui->Viewports).Data);
  IVar1 = (pIVar2->Style).DisplaySafeAreaPadding;
  fVar3 = IVar1.x;
  fVar4 = IVar1.y;
  fVar3 = (float)((uint)-fVar3 & -(uint)(fVar3 + fVar3 < IVar5.Max.x - IVar5.Min.x));
  fVar4 = (float)((uint)-fVar4 & -(uint)(fVar4 + fVar4 < IVar5.Max.y - IVar5.Min.y));
  IVar6.Min.x = IVar5.Min.x - fVar3;
  IVar6.Min.y = IVar5.Min.y - fVar4;
  IVar6.Max.x = IVar5.Max.x + fVar3;
  IVar6.Max.y = IVar5.Max.y + fVar4;
  return IVar6;
}

Assistant:

ImRect ImGui::GetPopupAllowedExtentRect(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_UNUSED(window);
    ImRect r_screen = ((ImGuiViewportP*)(void*)GetMainViewport())->GetMainRect();
    ImVec2 padding = g.Style.DisplaySafeAreaPadding;
    r_screen.Expand(ImVec2((r_screen.GetWidth() > padding.x * 2) ? -padding.x : 0.0f, (r_screen.GetHeight() > padding.y * 2) ? -padding.y : 0.0f));
    return r_screen;
}